

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevector.c
# Opt level: O0

sexp_conflict
sexp_bytevector_u32_ref_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg1,sexp_conflict arg2,
          sexp_conflict arg3)

{
  undefined1 auVar1 [16];
  uint32_t uVar2;
  int *in_RCX;
  undefined8 in_RSI;
  sexp_conflict in_RDI;
  int *in_R8;
  sexp_conflict res;
  sexp_conflict in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  char *arg1_00;
  sexp_conflict local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 8)) {
    if ((((ulong)in_R8 & 1) == 1) || ((((ulong)in_R8 & 3) == 0 && (*in_R8 == 0xc)))) {
      if (((ulong)in_R8 & 1) == 1) {
        auVar1._8_8_ = (long)in_R8 >> 0x3f;
        auVar1._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe;
        arg1_00 = SUB168(auVar1 / SEXT816(2),0);
      }
      else if ((((ulong)in_R8 & 3) == 0) && (*in_R8 == 0xc)) {
        in_stack_ffffffffffffff80 = (char *)((long)(char)in_R8[2] * *(long *)(in_R8 + 6));
        arg1_00 = in_stack_ffffffffffffff80;
      }
      else {
        in_stack_ffffffffffffff80 = (char *)0x0;
        arg1_00 = in_stack_ffffffffffffff80;
      }
      uVar2 = bytevector_u32_ref(in_RDI,arg1_00,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                                 in_stack_ffffffffffffff78);
      local_8 = (sexp_conflict)sexp_make_unsigned_integer(in_RDI,uVar2,0);
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_R8);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,8,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_bytevector_u32_ref_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg1, sexp arg2, sexp arg3) {
  sexp res;
  if (! sexp_bytesp(arg1))
    return sexp_type_exception(ctx, self, SEXP_BYTES, arg1);
  if (! sexp_exact_integerp(arg2))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg2);
  res = sexp_make_unsigned_integer(ctx, bytevector_u32_ref(ctx, sexp_bytes_data(arg1), sexp_sint_value(arg2), arg3));
  return res;
}